

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma2_encoder.c
# Opt level: O0

lzma_ret lzma2_encoder_init(lzma_lz_encoder *lz,lzma_allocator *allocator,void *options,
                           lzma_lz_options_conflict *lz_options)

{
  lzma_coder_conflict7 *plVar1;
  _Bool local_35;
  lzma_ret ret_;
  lzma_lz_options_conflict *lz_options_local;
  void *options_local;
  lzma_allocator *allocator_local;
  lzma_lz_encoder *lz_local;
  
  if (options == (void *)0x0) {
    lz_local._4_4_ = LZMA_PROG_ERROR;
  }
  else {
    if (lz->coder == (lzma_coder_conflict7 *)0x0) {
      plVar1 = (lzma_coder_conflict7 *)lzma_alloc(0x100a8,allocator);
      lz->coder = plVar1;
      if (lz->coder == (lzma_coder_conflict7 *)0x0) {
        return LZMA_MEM_ERROR;
      }
      lz->code = lzma2_encode;
      lz->end = lzma2_encoder_end;
      lz->options_update = lzma2_encoder_options_update;
      lz->coder->lzma = (lzma_coder_conflict7 *)0x0;
    }
    memcpy(&lz->coder->opt_cur,options,0x70);
    lz->coder->sequence = SEQ_INDICATOR;
    lz->coder->need_properties = true;
    lz->coder->need_state_reset = false;
    local_35 = true;
    if ((lz->coder->opt_cur).preset_dict != (uint8_t *)0x0) {
      local_35 = (lz->coder->opt_cur).preset_dict_size == 0;
    }
    lz->coder->need_dictionary_reset = local_35;
    lz_local._4_4_ =
         lzma_lzma_encoder_create
                   ((lzma_coder_conflict9 **)&lz->coder->lzma,allocator,&lz->coder->opt_cur,
                    lz_options);
    if (lz_local._4_4_ == LZMA_OK) {
      if (lz_options->before_size + lz_options->dict_size < 0x10000) {
        lz_options->before_size = 0x10000 - lz_options->dict_size;
      }
      lz_local._4_4_ = LZMA_OK;
    }
  }
  return lz_local._4_4_;
}

Assistant:

static lzma_ret
lzma2_encoder_init(lzma_lz_encoder *lz, lzma_allocator *allocator,
		const void *options, lzma_lz_options *lz_options)
{
	if (options == NULL)
		return LZMA_PROG_ERROR;

	if (lz->coder == NULL) {
		lz->coder = lzma_alloc(sizeof(lzma_coder), allocator);
		if (lz->coder == NULL)
			return LZMA_MEM_ERROR;

		lz->code = &lzma2_encode;
		lz->end = &lzma2_encoder_end;
		lz->options_update = &lzma2_encoder_options_update;

		lz->coder->lzma = NULL;
	}

	lz->coder->opt_cur = *(const lzma_options_lzma *)(options);

	lz->coder->sequence = SEQ_INIT;
	lz->coder->need_properties = true;
	lz->coder->need_state_reset = false;
	lz->coder->need_dictionary_reset
			= lz->coder->opt_cur.preset_dict == NULL
			|| lz->coder->opt_cur.preset_dict_size == 0;

	// Initialize LZMA encoder
	return_if_error(lzma_lzma_encoder_create(&lz->coder->lzma, allocator,
			&lz->coder->opt_cur, lz_options));

	// Make sure that we will always have enough history available in
	// case we need to use uncompressed chunks. They are used when the
	// compressed size of a chunk is not smaller than the uncompressed
	// size, so we need to have at least LZMA2_COMPRESSED_MAX bytes
	// history available.
	if (lz_options->before_size + lz_options->dict_size < LZMA2_CHUNK_MAX)
		lz_options->before_size
				= LZMA2_CHUNK_MAX - lz_options->dict_size;

	return LZMA_OK;
}